

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

void convert_32s_C2P2(OPJ_INT32 *pSrc,OPJ_INT32 **pDst,OPJ_SIZE_T length)

{
  OPJ_INT32 *pOVar1;
  OPJ_INT32 *pOVar2;
  OPJ_SIZE_T OVar3;
  
  if (length != 0) {
    pOVar1 = *pDst;
    pOVar2 = pDst[1];
    OVar3 = 0;
    do {
      pOVar1[OVar3] = pSrc[OVar3 * 2];
      pOVar2[OVar3] = pSrc[OVar3 * 2 + 1];
      OVar3 = OVar3 + 1;
    } while (length != OVar3);
  }
  return;
}

Assistant:

static void convert_32s_C2P2(const OPJ_INT32* pSrc, OPJ_INT32* const* pDst, OPJ_SIZE_T length)
{
	OPJ_SIZE_T i;
	OPJ_INT32* pDst0 = pDst[0];
	OPJ_INT32* pDst1 = pDst[1];
	
	for (i = 0; i < length; i++) {
		pDst0[i] = pSrc[2*i+0];
		pDst1[i] = pSrc[2*i+1];
	}
}